

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_breadth_first.cpp
# Opt level: O3

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* __thiscall
HBF::heuristic_nhh_euclidean
          (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           *__return_storage_ptr__,HBF *this,
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          *grid,vector<int,_std::allocator<int>_> *goal)

{
  int iVar1;
  pointer pvVar2;
  pointer pvVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pvVar6;
  int *piVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  long lVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  int iVar20;
  double dVar21;
  undefined1 auVar22 [16];
  double dVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  allocator_type local_52;
  allocator_type local_51;
  value_type_conflict1 local_50;
  vector<double,_std::allocator<double>_> local_48;
  long lVar19;
  
  pvVar2 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_50 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_48,
             (long)*(pointer *)
                    ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data + 8) -
             *(long *)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data >> 2,&local_50,&local_51);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,((long)pvVar3 - (long)pvVar2 >> 3) * -0x5555555555555555,&local_48
           ,&local_52);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  auVar10 = _DAT_00106120;
  auVar9 = _DAT_00106110;
  pvVar2 = (grid->
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar11 = (long)(grid->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar2;
  if (lVar11 != 0) {
    lVar11 = (lVar11 >> 3) * -0x5555555555555555;
    piVar4 = (pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
             ._M_start;
    piVar5 = *(pointer *)
              ((long)&(pvVar2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data + 8);
    lVar12 = (long)piVar5 - (long)piVar4 >> 2;
    pvVar6 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar12 = lVar12 + (ulong)(lVar12 == 0);
    lVar13 = lVar12 + -1;
    auVar16._8_4_ = (int)lVar13;
    auVar16._0_8_ = lVar13;
    auVar16._12_4_ = (int)((ulong)lVar13 >> 0x20);
    lVar13 = 0;
    auVar16 = auVar16 ^ _DAT_00106120;
    do {
      if (piVar5 != piVar4) {
        piVar7 = (goal->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar15 = (int)lVar13 - piVar7[1];
        iVar1 = -iVar15;
        if (0 < iVar15) {
          iVar1 = iVar15;
        }
        dVar17 = (double)iVar1 * (double)iVar1;
        lVar8 = *(long *)&pvVar6[lVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data;
        iVar1 = *piVar7;
        uVar14 = 0;
        auVar18 = auVar9;
        iVar15 = 0;
        iVar20 = 1;
        do {
          auVar22 = auVar18 ^ auVar10;
          uVar26 = iVar15 - iVar1;
          uVar27 = iVar20 - iVar1;
          uVar24 = (int)uVar26 >> 0x1f;
          uVar25 = (int)uVar27 >> 0x1f;
          dVar21 = (double)(int)((uVar26 ^ uVar24) - uVar24);
          dVar23 = (double)(int)((uVar27 ^ uVar25) - uVar25);
          if ((bool)(~(auVar16._4_4_ < auVar22._4_4_ ||
                      auVar16._0_4_ < auVar22._0_4_ && auVar22._4_4_ == auVar16._4_4_) & 1)) {
            *(double *)(lVar8 + uVar14 * 8) = SQRT(dVar21 * dVar21 + dVar17);
          }
          if (auVar22._12_4_ <= auVar16._12_4_ &&
              (auVar22._8_4_ <= auVar16._8_4_ || auVar22._12_4_ != auVar16._12_4_)) {
            *(double *)(lVar8 + 8 + uVar14 * 8) = SQRT(dVar23 * dVar23 + dVar17);
          }
          uVar14 = uVar14 + 2;
          lVar19 = auVar18._8_8_;
          auVar18._0_8_ = auVar18._0_8_ + 2;
          auVar18._8_8_ = lVar19 + 2;
          iVar15 = iVar15 + 2;
          iVar20 = iVar20 + 2;
        } while ((lVar12 + 1U & 0xfffffffffffffffe) != uVar14);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar11 + (ulong)(lVar11 == 0));
  }
  return __return_storage_ptr__;
}

Assistant:

vector<vector<double> > HBF::heuristic_nhh_euclidean(vector<vector<int> > grid, vector<int> goal){
    /*
    Create the heuristic function for non-holonomic heuristic, which does not consider obstacles.
    A simple implementation that doesn't consider different trajectories at different points in cell.
    */

    vector<vector<double> > heuristic(grid.size(), vector<double>(grid[0].size(), 0));

    // give obstacles a very large value
    for (int i = 0; i < grid.size(); i ++){
        for (int j = 0; j < grid[0].size(); j ++){
            heuristic[i][j] = sqrt(pow(abs(i-goal[1]),2)+pow(abs(j-goal[0]),2));
        }
    }

    return heuristic;

}